

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O1

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMethod *stm)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  initializer_list<INode_*> __l;
  ChildrenAnswers answers;
  vector<INode_*,_std::allocator<INode_*>_> children;
  allocator_type local_e9;
  vector<INode_*,_std::allocator<INode_*>_> local_e8;
  string local_d0;
  string local_b0;
  ChildrenAnswers local_90;
  ChildrenAnswers local_60;
  vector<INode_*,_std::allocator<INode_*>_> local_30;
  
  local_60.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(stm->returnType)._M_t.super___uniq_ptr_impl<CType,_std::default_delete<CType>_>.
                _M_t.super__Tuple_impl<0UL,_CType_*,_std::default_delete<CType>_>.
                super__Head_base<0UL,_CType_*,_false>._M_head_impl;
  local_60.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(stm->returnExp)._M_t.
                super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  local_60.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(stm->arguments)._M_t.
                super___uniq_ptr_impl<CArgumentList,_std::default_delete<CArgumentList>_>._M_t.
                super__Tuple_impl<0UL,_CArgumentList_*,_std::default_delete<CArgumentList>_>.
                super__Head_base<0UL,_CArgumentList_*,_false>._M_head_impl;
  local_60.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(stm->vars)._M_t.
                      super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t.
                      super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
                      super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  local_60.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(stm->statements)._M_t.
                       super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
                       super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
                       super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_60;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_30,__l,&local_e9);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&local_e8,&local_30);
  VisitChildren(&local_60,this,&local_e8);
  if (local_e8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90.descriptions,&local_60.descriptions);
  std::vector<int,_std::allocator<int>_>::vector(&local_90.ids,&local_60.ids);
  AddChildrenAnswers(this,&local_90);
  if (local_90.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.descriptions);
  if (stm->isPublic == true) {
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"PublicMethod","");
    AddLabel(this,&local_b0);
    _Var1._M_p = local_b0._M_dataplus._M_p;
  }
  else {
    paVar2 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"PrivateMethod","");
    AddLabel(this,&local_d0);
    _Var1._M_p = local_d0._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p);
  }
  this->lastVisited = this->lastVisited + 1;
  if ((CFieldList *)
      local_60.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (CFieldList *)0x0) {
    operator_delete(local_60.ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.descriptions);
  if (local_30.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CPrintVisitor::Visit(CMethod &stm) {
	std::vector<INode*> children = { stm.returnType.get(), stm.returnExp.get(), stm.arguments.get(), stm.vars.get(), stm.statements.get() };
	ChildrenAnswers answers = VisitChildren(children);

	AddChildrenAnswers(answers);
	if (stm.isPublic) {
		AddLabel("PublicMethod");
	} else {
		AddLabel("PrivateMethod");
	}
	++lastVisited;
}